

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetPropertyForTypeOfScoped<true,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  ScriptContext *scriptContext;
  UndeclaredBlockVariable *pUVar1;
  undefined1 local_60 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup local_48;
  AutoCleanup autoCleanup;
  
  autoCatchHandlerExists.m_threadContext = (ThreadContext *)defaultInstance;
  autoCleanup.scriptContext._4_4_ = propertyId;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_60,scriptContext,true);
  PatchGetPropertyForTypeOfScoped<true,Js::InlineCache>(Js::FunctionBody*,Js::
  InlineCache*,unsigned_int,Js::FrameDisplay*,int,void*)::AutoCleanup::AutoCleanup(Js::
  ScriptContext__(&local_48,scriptContext);
  pUVar1 = (UndeclaredBlockVariable *)
           PatchGetPropertyScoped<true,Js::InlineCache>
                     (functionBody,inlineCache,inlineCacheIndex,pDisplay,
                      autoCleanup.scriptContext._4_4_,autoCatchHandlerExists.m_threadContext);
  PatchGetPropertyForTypeOfScoped<true,_Js::InlineCache>::AutoCleanup::~AutoCleanup(&local_48);
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_60);
  if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr !=
      pUVar1) {
    return pUVar1;
  }
  JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
}

Assistant:

Var JavascriptOperators::PatchGetPropertyForTypeOfScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyForTypeOfScoped);
        Var value = nullptr;
        ScriptContext *scriptContext = functionBody->GetScriptContext();

        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        value = JavascriptOperators::PatchGetPropertyScoped<IsFromFullJit, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, pDisplay, propertyId, defaultInstance);
        END_TYPEOF_ERROR_HANDLER(scriptContext, value)

        return value;
        JIT_HELPER_END(Op_PatchGetPropertyForTypeOfScoped);
    }